

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O1

int __thiscall
soplex::CLUFactor<double>::vSolveLeft3
          (CLUFactor<double> *this,double eps,double *vec,int *idx,double *rhs,int *ridx,int rn,
          double *vec2,double *rhs2,int *ridx2,int rn2,double *vec3,double *rhs3,int *ridx3,int rn3)

{
  int iVar1;
  int iVar2;
  
  if ((this->l).updateType == 0) {
    iVar1 = solveUpdateLeft(this,eps,rhs,ridx,rn);
    iVar1 = solveUleft(this,eps,vec,idx,rhs,ridx,iVar1);
    iVar2 = solveUpdateLeft(this,eps,rhs2,ridx2,rn2);
    solveUleftNoNZ(this,eps,vec2,rhs2,ridx2,iVar2);
    iVar2 = solveUpdateLeft(this,eps,rhs3,ridx3,rn3);
    solveUleftNoNZ(this,eps,vec3,rhs3,ridx3,iVar2);
  }
  else {
    iVar1 = solveUleft(this,eps,vec,idx,rhs,ridx,rn);
    iVar1 = solveLleftForest(this,eps,vec,idx,iVar1);
    solveUleftNoNZ(this,eps,vec2,rhs2,ridx2,rn2);
    solveLleftForestNoNZ(this,vec2);
    solveUleftNoNZ(this,eps,vec3,rhs3,ridx3,rn3);
    solveLleftForestNoNZ(this,vec3);
  }
  iVar1 = solveLleft(this,eps,vec,idx,iVar1);
  solveLleftNoNZ(this,vec2);
  solveLleftNoNZ(this,vec3);
  return iVar1;
}

Assistant:

int CLUFactor<R>::vSolveLeft3(R eps,
                              R* vec, int* idx,                      /* result */
                              R* rhs, int* ridx, int rn,             /* rhs    */
                              R* vec2,                               /* result2 */
                              R* rhs2, int* ridx2, int rn2,          /* rhs2    */
                              R* vec3,                               /* result3 */
                              R* rhs3, int* ridx3, int rn3)          /* rhs3    */
{

   if(!l.updateType)             /* no Forest-Tomlin Updates */
   {
      rn = solveUpdateLeft(eps, rhs, ridx, rn);
      rn = solveUleft(eps, vec, idx, rhs, ridx, rn);
      rn2 = solveUpdateLeft(eps, rhs2, ridx2, rn2);
      solveUleftNoNZ(eps, vec2, rhs2, ridx2, rn2);
      rn3 = solveUpdateLeft(eps, rhs3, ridx3, rn3);
      solveUleftNoNZ(eps, vec3, rhs3, ridx3, rn3);
   }
   else
   {
      rn = solveUleft(eps, vec, idx, rhs, ridx, rn);
      rn = solveLleftForest(eps, vec, idx, rn);
      solveUleftNoNZ(eps, vec2, rhs2, ridx2, rn2);
      solveLleftForestNoNZ(vec2);
      solveUleftNoNZ(eps, vec3, rhs3, ridx3, rn3);
      solveLleftForestNoNZ(vec3);
   }

   rn = solveLleft(eps, vec, idx, rn);

   solveLleftNoNZ(vec2);
   solveLleftNoNZ(vec3);

   return rn;
}